

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O0

void * private_ACUtilsTest_ADynArray_realloc(void *ptr,size_t size)

{
  void *tmp;
  size_t size_local;
  void *ptr_local;
  
  if ((private_ACUtilsTest_ADynArray_reallocFail == false) ||
     (private_ACUtilsTest_ADynArray_reallocFailCounter != 0)) {
    if (private_ACUtilsTest_ADynArray_reallocFail != false) {
      private_ACUtilsTest_ADynArray_reallocFailCounter =
           private_ACUtilsTest_ADynArray_reallocFailCounter - 1;
    }
    ptr_local = realloc(ptr,size);
    if (ptr_local != (void *)0x0) {
      private_ACUtilsTest_ADynArray_reallocCount = private_ACUtilsTest_ADynArray_reallocCount + 1;
    }
  }
  else {
    ptr_local = (void *)0x0;
  }
  return ptr_local;
}

Assistant:

static void* private_ACUtilsTest_ADynArray_realloc(void *ptr, size_t size) {
    if(!private_ACUtilsTest_ADynArray_reallocFail || private_ACUtilsTest_ADynArray_reallocFailCounter > 0) {
        if(private_ACUtilsTest_ADynArray_reallocFail)
            --private_ACUtilsTest_ADynArray_reallocFailCounter;
        void* tmp = realloc(ptr, size);
        if(tmp != nullptr)
            ++private_ACUtilsTest_ADynArray_reallocCount;
        return tmp;
    }
    return nullptr;
}